

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

char * ImStristr(char *haystack,char *haystack_end,char *needle,char *needle_end)

{
  int iVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  char *in_RCX;
  char *in_RDX;
  char *in_RSI;
  char *in_RDI;
  char *a;
  char *b;
  char un0;
  bool local_4a;
  char *local_40;
  char *local_38;
  char *local_28;
  char *local_10;
  
  local_28 = in_RCX;
  if (in_RCX == (char *)0x0) {
    sVar4 = strlen(in_RDX);
    local_28 = in_RDX + sVar4;
  }
  iVar1 = toupper((int)*in_RDX);
  local_10 = in_RDI;
  do {
    if ((in_RSI != (char *)0x0) || (local_4a = true, *local_10 == '\0')) {
      local_4a = in_RSI != (char *)0x0 && local_10 < in_RSI;
    }
    if (!local_4a) {
      return (char *)0x0;
    }
    iVar2 = toupper((int)*local_10);
    if (iVar2 == (char)iVar1) {
      local_40 = local_10;
      for (local_38 = in_RDX + 1; local_40 = local_40 + 1, local_38 < local_28;
          local_38 = local_38 + 1) {
        iVar2 = toupper((int)*local_40);
        iVar3 = toupper((int)*local_38);
        if (iVar2 != iVar3) break;
      }
      if (local_38 == local_28) {
        return local_10;
      }
    }
    local_10 = local_10 + 1;
  } while( true );
}

Assistant:

const char* ImStristr(const char* haystack, const char* haystack_end, const char* needle, const char* needle_end)
{
    if (!needle_end)
        needle_end = needle + strlen(needle);

    const char un0 = (char)toupper(*needle);
    while ((!haystack_end && *haystack) || (haystack_end && haystack < haystack_end))
    {
        if (toupper(*haystack) == un0)
        {
            const char* b = needle + 1;
            for (const char* a = haystack + 1; b < needle_end; a++, b++)
                if (toupper(*a) != toupper(*b))
                    break;
            if (b == needle_end)
                return haystack;
        }
        haystack++;
    }
    return NULL;
}